

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

int Gia_ManFraigCheckCis(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  
  if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff) {
    __assert_fail("Gia_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                  ,0xdf,"int Gia_ManFraigCheckCis(Gia_Man_t *, Gia_Obj_t *)");
  }
  do {
    if (((undefined1  [12])*pObj & (undefined1  [12])0x9fffffff) != (undefined1  [12])0x9fffffff) {
      return 0;
    }
    iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
    pObj = pObj + -1;
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int Gia_ManFraigCheckCis( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    for ( assert( Gia_ObjIsCi(pObj) ); Gia_ObjIsCi(pObj); pObj-- )
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            return 1;
    return 0;
}